

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall
capnp::compiler::Compiler::Node::traverseAnnotations
          (Node *this,Reader *annotations,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  bool bVar1;
  Impl *this_00;
  uint64_t id;
  Iterator IVar2;
  Maybe<capnp::compiler::Compiler::Node_&> local_c0;
  Node *local_b8;
  Node *node;
  Reader annotation;
  undefined1 local_70 [8];
  Iterator __end2;
  undefined1 local_50 [8];
  Iterator __begin2;
  Reader *__range2;
  Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo_local;
  SchemaLoader *finalLoader_local;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  *seen_local;
  uint eagerness_local;
  Reader *annotations_local;
  Node *this_local;
  
  __begin2._8_8_ = annotations;
  IVar2 = List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader::begin(annotations);
  __end2._8_8_ = IVar2.container;
  __begin2.container._0_4_ = IVar2.index;
  local_50 = (undefined1  [8])__end2._8_8_;
  IVar2 = List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader::end((Reader *)__begin2._8_8_);
  annotation._reader._40_8_ = IVar2.container;
  __end2.container._0_4_ = IVar2.index;
  local_70 = (undefined1  [8])annotation._reader._40_8_;
  while( true ) {
    bVar1 = _::
            IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
            ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                          *)local_50,
                         (IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                          *)local_70);
    if (!bVar1) break;
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
    ::operator*((Reader *)&node,
                (IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                 *)local_50);
    this_00 = CompiledModule::getCompiler(this->module);
    id = capnp::schema::Annotation::Reader::getId((Reader *)&node);
    local_c0 = Compiler::Impl::findNode(this_00,id);
    local_b8 = kj::_::readMaybe<capnp::compiler::Compiler::Node>(&local_c0);
    if (local_b8 != (Node *)0x0) {
      traverse(local_b8,eagerness,seen,finalLoader,sourceInfo);
    }
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
                  *)local_50);
  }
  return;
}

Assistant:

void Compiler::Node::traverseAnnotations(const List<schema::Annotation>::Reader& annotations,
                                         uint eagerness,
                                         std::unordered_map<Node*, uint>& seen,
                                         const SchemaLoader& finalLoader,
                                         kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  for (auto annotation: annotations) {
    KJ_IF_MAYBE(node, module->getCompiler().findNode(annotation.getId())) {
      node->traverse(eagerness, seen, finalLoader, sourceInfo);
    }
  }
}